

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O2

int main(int argc,char **argv)

{
  qnode_ptr_t ptVar1;
  int sx;
  uint sy;
  FILE *pFVar2;
  qnode_ptr_t *flh_00;
  qnode_ptr_t q;
  int sx_00;
  int local_384;
  int col;
  int row;
  double local_378;
  int a;
  float div;
  qnode_ptr_t flq;
  qnode_ptr_t im2q;
  qnode_ptr_t im2h;
  qnode_ptr_t im1h;
  int local_344;
  int ssd;
  int iter;
  int nbin;
  int histo;
  int h_type;
  int f_type;
  int pyr;
  int sf;
  int sp;
  int sm;
  int n2;
  int n1;
  float incr;
  float trsh;
  qnode_ptr_t im1q;
  qnode_ptr_t flh;
  int binary;
  int local_2f4;
  uint local_2f0;
  int local_2ec;
  int local_2e8;
  float density;
  float std;
  float avg_err;
  uchar hd [32];
  string f2;
  string f1;
  string v_fname;
  string h_fname;
  string c_fname;
  string i_fname;
  string out_path;
  string in_path;
  
  valid_option(argc,argv,in_path,out_path,&n1,&n2,&local_384,&h_type,&histo,&sm,&sp,&sf,&pyr,&ssd,
               &f_type,&trsh,i_fname,v_fname,c_fname,h_fname,&nbin,&incr,&iter,&binary,&row,&col);
  puts("STAGE 1: Options Validated");
  fflush(_stdout);
  im1h = (qnode_ptr_t)0x0;
  im1q = (qnode_ptr_t)0x0;
  im2h = (qnode_ptr_t)0x0;
  im2q = (qnode_ptr_t)0x0;
  flh = (qnode_ptr_t)0x0;
  flq = (qnode_ptr_t)0x0;
  kera.k[0] = 1.0;
  kera.k[1] = 5.0;
  kera.k[2] = 8.0;
  kera.k[3] = 5.0;
  kera.k[4] = 1.0;
  kera.f = 20.0;
  kera.m = 5;
  kerb.k[0] = 1.0;
  kerb.k[1] = 5.0;
  kerb.k[2] = 8.0;
  kerb.k[3] = 5.0;
  kerb.k[4] = 1.0;
  kerb.f = 10.0;
  kerb.m = 5;
  filenames(i_fname,n1,n2,f1,f2,&div);
  sy = row;
  sx = col;
  local_344 = binary;
  if (binary == 0) {
    raster_size(f1,&local_2ec,&local_2f4,&a);
    raster_size(f2,&local_2e8,(int *)&local_2f0,&a);
    valid_size(&local_2ec,&local_2f4);
    local_378 = (double)CONCAT44(local_378._4_4_,local_2f4);
    sx = local_2e8;
    sy = local_2f0;
    sx_00 = local_2ec;
  }
  else {
    binary_size(col,row,&a);
    local_378 = (double)CONCAT44(local_378._4_4_,sy);
    sx_00 = sx;
  }
  puts("STAGE 2: Initializations Completed");
  fflush(_stdout);
  create_pyramid(&im1h,&im1q,local_384,a,sx_00,local_378._0_4_,2);
  create_pyramid(&im2h,&im2q,local_384,a,sx,sy,2);
  ptVar1 = im1q;
  if (local_344 == 0) {
    pgetrast(f1,hd,*im1q->gauss_ptr,sx_00,local_378._0_4_,a);
    q = im2q;
    flh_00 = (qnode_ptr_t *)(ulong)sy;
    pgetrast(f2,hd,*im2q->gauss_ptr,sx,sy,a);
  }
  else {
    Bpgetrast(f1,*im1q->gauss_ptr,col,row,a);
    q = im2q;
    flh_00 = (qnode_ptr_t *)(ulong)(uint)a;
    Bpgetrast(f2,*im2q->gauss_ptr,col,row,a);
  }
  puts("STAGE 3: Input Data Read");
  fflush(_stdout);
  if (pyr == 2) {
    cons_lap(ptVar1);
    cons_lap(q);
  }
  else {
    cons_gauss(ptVar1);
    cons_gauss(q);
  }
  puts("STAGE 4: Pyramids Created");
  fflush(_stdout);
  if (ssd == 7) {
    init_beaudet7(&Ix,&Ixx,&Ixy);
  }
  else if (ssd == 5) {
    init_beaudet5(&Ix,&Ixx,&Ixy);
  }
  else if (ssd == 3) {
    init_beaudet3(&Ix,&Ixx,&Ixy);
  }
  while( true ) {
    local_384 = local_384 + -1;
    if ((im1h == (qnode_ptr_t)0x0) || (im2h == (qnode_ptr_t)0x0)) break;
    ptVar1 = create_node(local_384,im1h->res,im1h->sizx,im1h->sizy);
    insert_node(ptVar1,&flh,&flq);
    alloc_flow(ptVar1);
    compute_flow(&im1h,&im1q,&im2h,&im2q,flh_00,&flq,sm,sp,iter);
  }
  puts("STAGE 5: Flow Estimated");
  pFVar2 = _stdout;
  fflush(_stdout);
  if (sf != 0) {
    filter(flq,flq,f_type,SUB84((double)trsh,0));
    puts("STAGE 6: Filtering Out Completed");
    pFVar2 = _stdout;
    fflush(_stdout);
  }
  if (histo == 0) {
    dump_flow((qnode_ptr_t *)pFVar2,&flq,v_fname,SUB84((double)div,0));
    puts("STAGE 8: Flow Field Written to File");
    fflush(_stdout);
    puts("STAGE 9: End of Program\n");
  }
  else {
    local_378 = (double)div;
    prod_histo(flq,c_fname,h_fname,nbin,SUB84((double)incr,0),h_type,&avg_err,&std,&density,
               SUB84(local_378,0));
    puts("STAGE 7: Histograms Produced");
    pFVar2 = _stdout;
    fflush(_stdout);
    dump_flow((qnode_ptr_t *)pFVar2,&flq,v_fname,SUB84(local_378,0));
    puts("STAGE 8: Flow Field Written to File");
    fflush(_stdout);
    puts("STAGE 9: End of Program\n");
    printf("         Average Angular Error: %10.5f\n",SUB84((double)avg_err,0));
    printf("            Standard Deviation: %10.5f\n",SUB84((double)std,0));
    printf("                       Density: %10.5f\n",SUB84((double)density * 100.0,0));
    fflush(_stdout);
  }
  return 0;
}

Assistant:

int main(argc,argv)
int argc ;
char *argv[] ;

{ qnode_ptr_t create_node(), im1h, im1q, im2h, im2q, flh, flq, fl ;
  unsigned char hd[H] ;
  float trsh, incr, div, avg_err, std, density ;
  int n1, n2, level, sm, sp, sf, pyr, f_type, h_type, histo, nbin, iter, ssd,
  x[N_FRAME], y[N_FRAME], a, binary, row, col ;
  string in_path, out_path, v_fname, i_fname, c_fname, h_fname, f1, f2 ;

  valid_option(argc,argv,in_path,out_path,&n1,&n2,&level,&h_type,&histo,&sm,
               &sp,&sf,&pyr,&ssd,&f_type,&trsh,i_fname,v_fname,c_fname,h_fname,
               &nbin,&incr,&iter,&binary,&row,&col) ;
  printf("STAGE 1: Options Validated\n") ; fflush(stdout) ;
  init_list(&im1h,&im1q) ;
  init_list(&im2h,&im2q) ;
  init_list(&flh,&flq) ;
  init_kernel_a(&kera) ;
  init_kernel_b(&kerb) ;
  filenames(i_fname,n1,n2,f1,f2,&div) ;
  if (!binary) {
    raster_size(f1,&(x[0]),&(y[0]),&a) ;
    raster_size(f2,&(x[1]),&(y[1]),&a) ;
    valid_size(x,y) ;
  }
  else {
    x[0] = col ; x[1] = col ;
    y[0] = row ; y[1] = row ;
    binary_size(col,row,&a) ;
  }
  printf("STAGE 2: Initializations Completed\n") ; fflush(stdout) ;
  create_pyramid(&im1h,&im1q,level,a,x[0],y[0],2) ;
  create_pyramid(&im2h,&im2q,level,a,x[1],y[1],2) ;
  if (!binary) {
    pgetrast(f1,hd,im1q->gauss_ptr,x[0],y[0],a) ;
    pgetrast(f2,hd,im2q->gauss_ptr,x[1],y[1],a) ;
  }
  else {
    Bpgetrast(f1,im1q->gauss_ptr,col,row,a) ;
    Bpgetrast(f2,im2q->gauss_ptr,col,row,a) ;
  }
  printf("STAGE 3: Input Data Read\n") ; fflush(stdout) ;
  if (pyr == LAP) {
    cons_lap(im1q) ;
    cons_lap(im2q) ;
  }
  else {
    cons_gauss(im1q) ;
    cons_gauss(im2q) ;
  }
  printf("STAGE 4: Pyramids Created\n") ; fflush(stdout) ;
  if (ssd == 3) {
    init_beaudet3(&Ix,&Ixx,&Ixy) ;
  }
  else {
    if (ssd == 5) {
      init_beaudet5(&Ix,&Ixx,&Ixy) ;
    }
    else {
      if (ssd == 7) {
        init_beaudet7(&Ix,&Ixx,&Ixy) ;
      }
    }
  }
  level -= 1 ;
  while ((im1h != (qnode_ptr_t)NULL) && (im2h != (qnode_ptr_t)NULL)) {
    fl = create_node(level,im1h->res,im1h->sizx,im1h->sizy) ;
    insert_node(fl,&flh,&flq) ;
    alloc_flow(fl) ;
    compute_flow(&im1h,&im1q,&im2h,&im2q,&flh,&flq,sm,sp,iter) ;
    level-- ;
  }
  printf("STAGE 5: Flow Estimated\n") ; fflush(stdout) ;
  if (sf) {
    filter(flq,flq,f_type,trsh) ;
    printf("STAGE 6: Filtering Out Completed\n") ; fflush(stdout) ;
  }
  if (histo) {
    prod_histo(flq,c_fname,h_fname,nbin,incr,h_type,&avg_err,&std,&density,div) ;
    printf("STAGE 7: Histograms Produced\n") ; fflush(stdout) ;
  }
  dump_flow(&flh,&flq,v_fname,div) ;
  printf("STAGE 8: Flow Field Written to File\n") ; fflush(stdout) ;
  printf("STAGE 9: End of Program\n\n") ;
  if (histo) {
    printf("         Average Angular Error: %10.5f\n", avg_err) ;
    printf("            Standard Deviation: %10.5f\n", std) ;
    printf("                       Density: %10.5f\n", density*100.0) ;
    fflush(stdout) ;
  }
}